

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# version_set.cc
# Opt level: O2

int64_t __thiscall leveldb::VersionSet::MaxNextLevelOverlappingBytes(VersionSet *this)

{
  long lVar1;
  Version *this_00;
  pointer ppFVar2;
  FileMetaData *pFVar3;
  long lVar4;
  int64_t iVar5;
  long lVar6;
  size_t i;
  ulong uVar7;
  long lVar8;
  long in_FS_OFFSET;
  vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_> overlaps;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  overlaps.super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  overlaps.super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  overlaps.super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  lVar6 = 0;
  lVar4 = 1;
  while (lVar8 = lVar4, lVar8 != 6) {
    uVar7 = 0;
    while( true ) {
      this_00 = this->current_;
      ppFVar2 = this_00->files_[lVar8].
                super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>
                ._M_impl.super__Vector_impl_data._M_start;
      lVar4 = lVar8 + 1;
      if ((ulong)((long)this_00->files_[lVar8].
                        super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>
                        ._M_impl.super__Vector_impl_data._M_finish - (long)ppFVar2 >> 3) <= uVar7)
      break;
      pFVar3 = ppFVar2[uVar7];
      Version::GetOverlappingInputs
                (this_00,(int)(lVar8 + 1),&pFVar3->smallest,&pFVar3->largest,&overlaps);
      iVar5 = TotalFileSize(&overlaps);
      if (lVar6 < iVar5) {
        lVar6 = iVar5;
      }
      uVar7 = uVar7 + 1;
    }
  }
  std::_Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>::
  ~_Vector_base(&overlaps.
                 super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>
               );
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return lVar6;
  }
  __stack_chk_fail();
}

Assistant:

int64_t VersionSet::MaxNextLevelOverlappingBytes() {
  int64_t result = 0;
  std::vector<FileMetaData*> overlaps;
  for (int level = 1; level < config::kNumLevels - 1; level++) {
    for (size_t i = 0; i < current_->files_[level].size(); i++) {
      const FileMetaData* f = current_->files_[level][i];
      current_->GetOverlappingInputs(level + 1, &f->smallest, &f->largest,
                                     &overlaps);
      const int64_t sum = TotalFileSize(overlaps);
      if (sum > result) {
        result = sum;
      }
    }
  }
  return result;
}